

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.hpp
# Opt level: O1

void __thiscall Logger::FileOutputSink::~FileOutputSink(FileOutputSink *this)

{
  Lock *this_00;
  
  (this->super_OutputSink)._vptr_OutputSink = (_func_int **)&PTR_checkFlags_00131450;
  this_00 = &this->lock;
  Threading::FastLock::_Lock(this_00,(TimeOut *)&Threading::Infinite);
  if ((FILE *)this->file != (FILE *)0x0) {
    fclose((FILE *)this->file);
  }
  this->file = (FILE *)0x0;
  Threading::FastLock::_Unlock(this_00,(void *)0x0);
  Threading::FastLock::~FastLock(this_00);
  return;
}

Assistant:

~FileOutputSink() { Threading::ScopedLock scope(lock); if (file) fclose(file); file = 0; }